

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

void __thiscall
Catch::Matchers::Exception::ExceptionMessageMatcher::ExceptionMessageMatcher
          (ExceptionMessageMatcher *this,string *message)

{
  string *in_RSI;
  undefined8 *in_RDI;
  MatcherBase<std::exception> *in_stack_ffffffffffffffe0;
  
  Impl::MatcherBase<std::exception>::MatcherBase(in_stack_ffffffffffffffe0);
  *in_RDI = &PTR__ExceptionMessageMatcher_00287e80;
  in_RDI[5] = &DAT_00287eb0;
  std::__cxx11::string::string((string *)(in_RDI + 6),in_RSI);
  return;
}

Assistant:

ExceptionMessageMatcher(std::string const& message):
        m_message(message)
    {}